

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_common.c
# Opt level: O0

LY_ERR ly_time_str2time(char *value,time_t *time,char **fractions_s)

{
  int iVar1;
  size_t sVar2;
  time_t tVar3;
  ushort **ppuVar4;
  long lVar5;
  long lVar6;
  char *pcVar7;
  ulong uVar8;
  time_t t;
  int64_t shift_m;
  int64_t shift;
  char *ptr;
  char *frac;
  uint32_t frac_len;
  uint32_t i;
  tm tm;
  char **fractions_s_local;
  time_t *time_local;
  char *value_local;
  
  tm.tm_zone = (char *)fractions_s;
  memset(&frac_len,0,0x38);
  if (value == (char *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","value","ly_time_str2time"
          );
    value_local._4_4_ = LY_EINVAL;
  }
  else {
    sVar2 = strlen(value);
    if (sVar2 < 0x12) {
      ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","strlen(value) > 17",
             "ly_time_str2time");
      value_local._4_4_ = LY_EINVAL;
    }
    else if (time == (time_t *)0x0) {
      ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","time",
             "ly_time_str2time");
      value_local._4_4_ = LY_EINVAL;
    }
    else {
      iVar1 = atoi(value);
      tm.tm_mday = iVar1 + -0x76c;
      iVar1 = atoi(value + 5);
      tm.tm_hour = iVar1 + -1;
      tm.tm_min = atoi(value + 8);
      tm.tm_sec = atoi(value + 0xb);
      i = atoi(value + 0xe);
      frac_len = atoi(value + 0x11);
      if (tm.tm_hour < 0xc) {
        if ((tm.tm_min < 1) || (0x1f < tm.tm_min)) {
          ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid date-and-time day of month \"%d\".",
                 (ulong)(uint)tm.tm_min);
          value_local._4_4_ = LY_EINVAL;
        }
        else if (tm.tm_sec < 0x18) {
          if ((int)i < 0x3c) {
            if ((int)frac_len < 0x3d) {
              tVar3 = timegm((tm *)&frac_len);
              frac._4_4_ = 0x13;
              if (value[0x13] == '.') {
                frac._4_4_ = 0x14;
                ptr = value + 0x14;
                frac._0_4_ = 0;
                while (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)ptr[(uint)frac]] & 0x800) != 0) {
                  frac._0_4_ = (uint)frac + 1;
                }
                if ((uint)frac == 0) {
                  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,
                         "Missing date-and-time fractions after \'.\'.");
                  return LY_EINVAL;
                }
                frac._4_4_ = (uint)frac + frac._4_4_;
              }
              else {
                ptr = (char *)0x0;
              }
              if ((value[frac._4_4_] == 'Z') || (value[frac._4_4_] == 'z')) {
                shift_m = 0;
              }
              else {
                uVar8 = (ulong)frac._4_4_;
                lVar5 = strtol(value + uVar8,(char **)&shift,10);
                if (0x17 < lVar5) {
                  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,
                         "Invalid date-and-time timezone hour \"%li\".",lVar5);
                  return LY_EINVAL;
                }
                if (*(char *)shift != ':') {
                  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,
                         "Invalid date-and-time timezone hour \"%s\".",value + uVar8);
                  return LY_EINVAL;
                }
                lVar6 = strtol((char *)(shift + 1),(char **)0x0,10);
                if ((lVar6 < 0) || (0x3b < lVar6)) {
                  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,
                         "Invalid date-and-time timezone minutes \"%li\".",lVar6);
                  return LY_EINVAL;
                }
                t = lVar6 * 0x3c;
                if (lVar5 * 0xe10 < 0) {
                  t = lVar6 * -0x3c;
                }
                shift_m = lVar5 * 0xe10 + t;
              }
              *time = tVar3 - shift_m;
              if (tm.tm_zone != (char *)0x0) {
                if (ptr == (char *)0x0) {
                  tm.tm_zone[0] = '\0';
                  tm.tm_zone[1] = '\0';
                  tm.tm_zone[2] = '\0';
                  tm.tm_zone[3] = '\0';
                  tm.tm_zone[4] = '\0';
                  tm.tm_zone[5] = '\0';
                  tm.tm_zone[6] = '\0';
                  tm.tm_zone[7] = '\0';
                }
                else {
                  pcVar7 = strndup(ptr,(ulong)(uint)frac);
                  *(char **)tm.tm_zone = pcVar7;
                  if (*(long *)tm.tm_zone == 0) {
                    return LY_EMEM;
                  }
                }
              }
              value_local._4_4_ = LY_SUCCESS;
            }
            else {
              ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid date-and-time seconds \"%d\".",
                     (ulong)frac_len);
              value_local._4_4_ = LY_EINVAL;
            }
          }
          else {
            ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid date-and-time minutes \"%d\".",(ulong)i
                  );
            value_local._4_4_ = LY_EINVAL;
          }
        }
        else {
          ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid date-and-time hours \"%d\".",
                 (ulong)(uint)tm.tm_sec);
          value_local._4_4_ = LY_EINVAL;
        }
      }
      else {
        ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid date-and-time month \"%d\".",
               (ulong)(uint)tm.tm_hour);
        value_local._4_4_ = LY_EINVAL;
      }
    }
  }
  return value_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
ly_time_str2time(const char *value, time_t *time, char **fractions_s)
{
    struct tm tm = {0};
    uint32_t i, frac_len;
    const char *frac;
    char *ptr;
    int64_t shift, shift_m;
    time_t t;

    LY_CHECK_ARG_RET(NULL, value, strlen(value) > 17, time, LY_EINVAL);

    tm.tm_year = atoi(&value[0]) - 1900;
    tm.tm_mon = atoi(&value[5]) - 1;
    tm.tm_mday = atoi(&value[8]);
    tm.tm_hour = atoi(&value[11]);
    tm.tm_min = atoi(&value[14]);
    tm.tm_sec = atoi(&value[17]);

    /* explicit checks for some gross errors */
    if (tm.tm_mon > 11) {
        LOGERR(NULL, LY_EINVAL, "Invalid date-and-time month \"%d\".", tm.tm_mon);
        return LY_EINVAL;
    }
    if ((tm.tm_mday < 1) || (tm.tm_mday > 31)) {
        LOGERR(NULL, LY_EINVAL, "Invalid date-and-time day of month \"%d\".", tm.tm_mday);
        return LY_EINVAL;
    }
    if (tm.tm_hour > 23) {
        LOGERR(NULL, LY_EINVAL, "Invalid date-and-time hours \"%d\".", tm.tm_hour);
        return LY_EINVAL;
    }
    if (tm.tm_min > 59) {
        LOGERR(NULL, LY_EINVAL, "Invalid date-and-time minutes \"%d\".", tm.tm_min);
        return LY_EINVAL;
    }
    if (tm.tm_sec > 60) {
        LOGERR(NULL, LY_EINVAL, "Invalid date-and-time seconds \"%d\".", tm.tm_sec);
        return LY_EINVAL;
    }

    t = timegm(&tm);
    i = 19;

    /* fractions of a second */
    if (value[i] == '.') {
        ++i;
        frac = &value[i];
        for (frac_len = 0; isdigit(frac[frac_len]); ++frac_len) {}
        if (!frac_len) {
            LOGERR(NULL, LY_EINVAL, "Missing date-and-time fractions after '.'.");
            return LY_EINVAL;
        }

        i += frac_len;
    } else {
        frac = NULL;
    }

    /* apply offset */
    if ((value[i] == 'Z') || (value[i] == 'z')) {
        /* zero shift */
        shift = 0;
    } else {
        value += i;
        shift = strtol(value, &ptr, 10);
        if (shift > 23) {
            LOGERR(NULL, LY_EINVAL, "Invalid date-and-time timezone hour \"%" PRIi64 "\".", shift);
            return LY_EINVAL;
        } else if (ptr[0] != ':') {
            LOGERR(NULL, LY_EINVAL, "Invalid date-and-time timezone hour \"%s\".", value);
            return LY_EINVAL;
        }
        shift = shift * 60 * 60; /* convert from hours to seconds */

        value = ptr + 1;
        shift_m = strtol(value, NULL, 10);
        if ((shift_m < 0) || (shift_m > 59)) {
            LOGERR(NULL, LY_EINVAL, "Invalid date-and-time timezone minutes \"%" PRIi64 "\".", shift_m);
            return LY_EINVAL;
        }
        shift_m *= 60; /* convert from minutes to seconds */

        /* correct sign */
        if (shift < 0) {
            shift_m *= -1;
        }

        /* connect hours and minutes of the shift */
        shift = shift + shift_m;
    }

    /* we have to shift to the opposite way to correct the time */
    t -= shift;

    *time = t;
    if (fractions_s) {
        if (frac) {
            *fractions_s = strndup(frac, frac_len);
            LY_CHECK_RET(!*fractions_s, LY_EMEM);
        } else {
            *fractions_s = NULL;
        }
    }
    return LY_SUCCESS;
}